

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O1

bool chrono::utils::WriteCheckpoint(ChSystem *system,string *filename)

{
  ostringstream *this;
  ChBody *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  long lVar7;
  bool bVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  ostream *poVar13;
  pointer psVar14;
  ulong uVar15;
  double *v;
  double *pdVar16;
  bool bVar17;
  string tab;
  ChCoordsys<double> csys;
  vector<double,_std::allocator<double>_> dims;
  CSV_writer csv;
  long *local_268;
  long local_260;
  long local_258 [2];
  int local_244;
  ulong local_240;
  string local_238;
  double local_218;
  double local_210;
  double local_208;
  ChBody *local_200;
  double *local_1f8;
  double *local_1f0;
  long local_1e8;
  CSV_writer local_1e0;
  string *local_48;
  pointer local_40;
  pointer local_38;
  
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238," ","");
  CSV_writer::CSV_writer(&local_1e0,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"    ","");
  local_244 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                        (system);
  this = &local_1e0.m_ss;
  poVar13 = (ostream *)std::ostream::operator<<(this,(uint)(local_244 != 0));
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
  bVar8 = SUB81(this,0);
  std::ios::widen((char)*(undefined8 *)(local_1e0._32_8_ + -0x18) + bVar8);
  std::ostream::put(bVar8);
  std::ostream::flush();
  psVar14 = (system->assembly).bodylist.
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (system->assembly).bodylist.
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = psVar14 == local_40;
  local_48 = filename;
  do {
    if (bVar17) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
      CSV_writer::write_to_file(&local_1e0,local_48,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
LAB_009472a5:
      if (local_268 != local_258) {
        operator_delete(local_268,local_258[0] + 1);
      }
      CSV_writer::~CSV_writer(&local_1e0);
      return bVar17;
    }
    pCVar1 = (psVar14->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar14->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_38 = psVar14;
    poVar13 = (ostream *)
              std::ostream::operator<<(this,(pCVar1->super_ChPhysicsItem).super_ChObj.m_identifier);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    ChBody::GetBodyFixed(pCVar1);
    poVar13 = std::ostream::_M_insert<bool>(bVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])(pCVar1);
    poVar13 = std::ostream::_M_insert<bool>(bVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(char *)local_268,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    peVar2 = (pCVar1->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (pCVar1->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    iVar12 = (*peVar2->_vptr_ChCollisionModel[0x1e])();
    poVar13 = (ostream *)std::ostream::operator<<(this,(short)iVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    peVar2 = (pCVar1->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_01 = (pCVar1->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    iVar12 = (*peVar2->_vptr_ChCollisionModel[0x20])();
    poVar13 = (ostream *)std::ostream::operator<<(this,(short)iVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(char *)local_268,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    poVar13 = std::ostream::_M_insert<double>((pCVar1->variables).mass);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    ChBody::GetInertiaXX(pCVar1);
    poVar13 = std::ostream::_M_insert<double>((double)local_238._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>((double)local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>((double)local_238.field_2._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(char *)local_268,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.pos.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.pos.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.pos.m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.rot.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.rot.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.rot.m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.
                         super_ChFrame<double>.coord.rot.m_data[3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(char *)local_268,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data
                         [0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data
                         [1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data
                         [2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data
                         [0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data
                         [1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data
                         [2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::ostream::_M_insert<double>
                        ((pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data
                         [3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(char *)local_268,local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    std::ios::widen((char)*(undefined8 *)(local_1e0._32_8_ + -0x18) + bVar8);
    std::ostream::put(bVar8);
    std::ostream::flush();
    peVar2 = (pCVar1->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (pCVar1->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    psVar4 = (peVar2->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (peVar2->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_240 = (ulong)((long)psVar4 - (long)psVar5) >> 4;
    poVar13 = (ostream *)std::ostream::operator<<(this,(int)local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
    std::ios::widen((char)*(undefined8 *)(local_1e0._32_8_ + -0x18) + bVar8);
    std::ostream::put(bVar8);
    std::ostream::flush();
    if (0 < (int)(uint)local_240) {
      local_240 = (ulong)((uint)local_240 & 0x7fffffff);
      uVar15 = 0;
      local_200 = pCVar1;
      do {
        pCVar1 = local_200;
        peVar2 = (local_200->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var3 = (local_200->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        psVar4 = (peVar2->m_shapes).
                 super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)&psVar4[uVar15].
                          super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
        ;
        this_02._M_pi =
             psVar4[uVar15].
             super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          }
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        peVar2 = (pCVar1->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var3 = (pCVar1->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        (*peVar2->_vptr_ChCollisionModel[0x29])(&local_238,peVar2,uVar15 & 0xffffffff);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        poVar13 = std::ostream::_M_insert<double>((double)local_238._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>((double)local_238._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>((double)local_238.field_2._M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>((double)local_238.field_2._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>(local_210);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::ostream::_M_insert<double>(local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this,(char *)local_268,local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        lVar7 = *(long *)(lVar6 + 0x10);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x18);
        if (local_244 == 0) {
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
            }
          }
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0xc));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x14));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x1c));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x20));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x24));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x28));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x2c));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x30));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this,(char *)local_268,local_260);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        }
        else {
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
            }
          }
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x1c));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x20));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0xc));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x24));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x28));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x30));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x38));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x34));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + 0x3c));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this,(char *)local_268,local_260);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        peVar2 = (local_200->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var3 = (local_200->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        (*peVar2->_vptr_ChCollisionModel[0x2a])(&local_1f8,peVar2,uVar15 & 0xffffffff);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pdVar10 = local_1f0;
        pdVar9 = local_1f8;
        if (local_1f8 == local_1f0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n",0x47
                    );
        }
        else {
          poVar13 = (ostream *)std::ostream::operator<<(this,*(int *)(lVar6 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length);
          pdVar11 = local_1f0;
          for (pdVar16 = local_1f8; pdVar16 != pdVar11; pdVar16 = pdVar16 + 1) {
            poVar13 = std::ostream::_M_insert<double>(*pdVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,local_1e0.m_delim._M_dataplus._M_p,local_1e0.m_delim._M_string_length
                      );
          }
          std::ios::widen((char)*(undefined8 *)(local_1e0._32_8_ + -0x18) + bVar8);
          std::ostream::put(bVar8);
          std::ostream::flush();
        }
        if (local_1f8 != (double *)0x0) {
          operator_delete(local_1f8,local_1e8 - (long)local_1f8);
        }
        if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
        }
        if (pdVar9 == pdVar10) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          goto LAB_009472a5;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_240);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    psVar14 = local_38 + 1;
    bVar17 = psVar14 == local_40;
  } while( true );
}

Assistant:

bool WriteCheckpoint(ChSystem* system, const std::string& filename) {
    // Create the CSV stream.
    CSV_writer csv(" ");
    std::string tab("    ");

    // Write contact method type (0: NSC, 1: SMC)
    int ctype = (system->GetContactMethod() == ChContactMethod::NSC) ? 0 : 1;
    csv << ctype << std::endl;

    for (auto body : system->Get_bodylist()) {
        // Write body identifier, the body fixed flag, and the collide flag
        csv << body->GetIdentifier() << body->GetBodyFixed() << body->GetCollide() << tab;

        // Write collision family information.
        csv << body->GetCollisionModel()->GetFamilyGroup() << body->GetCollisionModel()->GetFamilyMask() << tab;

        // Write body mass and inertia
        csv << body->GetMass() << body->GetInertiaXX() << tab;

        // Write body position, orientation, and their time derivatives
        csv << body->GetPos() << body->GetRot() << tab;
        csv << body->GetPos_dt() << body->GetRot_dt() << tab;

        csv << std::endl;

        // Write number of collision shapes
        int n_shapes = body->GetCollisionModel()->GetNumShapes();
        csv << n_shapes << std::endl;

        // Loop over each shape and write its data on a separate line.
        // If we encounter an unsupported type, return false.
        for (int index = 0; index < n_shapes; index++) {
            auto shape = body->GetCollisionModel()->GetShape(index);

            // Write relative position and rotation
            ChCoordsys<> csys = body->GetCollisionModel()->GetShapePos(index);
            csv << csys.pos << csys.rot << tab;

            // Write shape material information
            if (ctype == 0) {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceNSC>(shape->GetMaterial());
                csv << mat->static_friction << mat->sliding_friction << mat->rolling_friction << mat->spinning_friction;
                csv << mat->restitution << mat->cohesion << mat->dampingf;
                csv << mat->compliance << mat->complianceT << mat->complianceRoll << mat->complianceSpin;
                csv << tab;
            } else {
                auto mat = std::static_pointer_cast<ChMaterialSurfaceSMC>(shape->GetMaterial());
                csv << mat->young_modulus << mat->poisson_ratio;
                csv << mat->static_friction << mat->sliding_friction;
                csv << mat->restitution << mat->constant_adhesion << mat->adhesionMultDMT;
                csv << mat->kn << mat->gn << mat->kt << mat->gt;
                csv << tab;
            }

            // Write shape type and characteristic dimensions
            std::vector<double> dims = body->GetCollisionModel()->GetShapeDimensions(index);
            if (dims.empty()) {
                std::cout << "utils::WriteCheckpoint ERROR: unknown or not supported collision shape\n";
                return false;
            }

            csv << shape->GetType() << dims;

            csv << std::endl;
        }
    }

    csv.write_to_file(filename);

    return true;
}